

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O2

void __thiscall bwtil::IndexedBWT::sampleSA(IndexedBWT *this,bool verbose)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ostream *poVar4;
  ulint i;
  ulong uVar5;
  undefined7 in_register_00000031;
  long lVar6;
  ulint v;
  item_reference<bv::internal::packed_view<std::vector>_> local_40;
  
  v = this->n;
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  lVar6 = -v;
  uVar5 = 1;
  i = 0;
  while (lVar6 = lVar6 + 1, v = v - 1, lVar6 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->n;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (lVar6 + this->n) * 100;
    uVar3 = SUB168(auVar2 / auVar1,0);
    if (((int)uVar5 != SUB164(auVar2 / auVar1,0) && verbose) &&
        (int)((uVar3 & 0xffffffff) % 10) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"   ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"% done.\n");
      uVar5 = uVar3 & 0xffffffff;
    }
    if (((this->marked_positions).bitvector.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[i >> 6] >> ((ulong)(byte)~(byte)i & 0x3f) & 1) != 0) {
      local_40._index = succinct_bitvector::rank1(&this->marked_positions,i);
      local_40._v = &this->text_pointers;
      bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=(&local_40,v);
    }
    i = LF(this,i);
  }
  local_40._index = succinct_bitvector::rank1(&this->marked_positions,i);
  local_40._v = &this->text_pointers;
  bv::internal::item_reference<bv::internal::packed_view<std::vector>_>::operator=(&local_40,0);
  return;
}

Assistant:

void sampleSA(bool verbose){//sample Suffix Array pointers (1 every offrate positions on text). Vector marked_positions must be already computed!

		ulint i=n-1;//current position on text
		ulint j=0;  //current position on the BWT (0=terminator position on the F column)
		uint perc;
		uint last_perc=1;

		if(verbose) cout << endl;

		while(i>0){

			perc = (100*(n-i))/n;

			if(verbose)
				if(perc%10==0 and perc!= last_perc){

					cout << "   " << perc << "% done.\n";
					last_perc=perc;

				}

			if(marked_positions.at(j)==1)
				text_pointers[marked_positions.rank1(j)] = i;

			j = LF(j);
			i--;

		}

		//i=0
		text_pointers[marked_positions.rank1(j)] = 0;

	}